

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.h
# Opt level: O2

size_t __thiscall
asmjit::v1_14::Support::BitVectorOpIterator<unsigned_long,_asmjit::v1_14::Support::AndNot>::next
          (BitVectorOpIterator<unsigned_long,_asmjit::v1_14::Support::AndNot> *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = *(ulong *)(this + 0x20);
  if (uVar1 != 0) {
    uVar6 = uVar1 - 1 & uVar1;
    uVar2 = *(ulong *)(this + 0x10);
    puVar4 = *(ulong **)this;
    puVar5 = *(ulong **)(this + 8);
    uVar7 = uVar2;
    while( true ) {
      uVar7 = uVar7 + 0x40;
      if ((uVar6 != 0) || (*(ulong *)(this + 0x10) = uVar7, *(ulong *)(this + 0x18) <= uVar7))
      break;
      *(ulong **)this = puVar4 + 1;
      uVar6 = *puVar4;
      *(ulong **)(this + 8) = puVar5 + 1;
      uVar6 = ~*puVar5 & uVar6;
      puVar4 = puVar4 + 1;
      puVar5 = puVar5 + 1;
    }
    lVar3 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    *(ulong *)(this + 0x20) = uVar6;
    return uVar2 + lVar3;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/../core/../core/../core/../core/../core/support.h"
             ,0x5a7,"bitWord != T(0)");
}

Assistant:

ASMJIT_FORCE_INLINE size_t next() noexcept {
    T bitWord = _current;
    ASMJIT_ASSERT(bitWord != T(0));

    uint32_t bit = ctz(bitWord);
    bitWord &= T(bitWord - 1u);

    size_t n = _idx + bit;
    while (!bitWord && (_idx += kTSizeInBits) < _end)
      bitWord = OperatorT::op(*_aPtr++, *_bPtr++);

    _current = bitWord;
    return n;
  }